

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

void __thiscall
duckdb::BindContext::RemoveContext(BindContext *this,vector<duckdb::BindingAlias,_true> *aliases)

{
  BindingAlias *pBVar1;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *puVar2;
  _Head_base<0UL,_duckdb::Binding_*,_false> _Var3;
  _Head_base<0UL,_duckdb::Binding_*,_false> _Var4;
  bool bVar5;
  pointer pBVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *removed_col;
  iterator __first;
  iterator __first_00;
  _Hash_node_base *p_Var7;
  long lVar8;
  pointer this_00;
  _Hash_node_base *p_Var9;
  long lVar10;
  pointer other;
  BindingAlias *pBVar11;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  removed_using_columns;
  case_insensitive_map_t<reference_set_t<UsingColumnSet>_> *__range2;
  long local_78;
  long lStack_70;
  undefined8 local_68;
  vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_true>
  *local_58;
  pointer local_50;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_48;
  value_type *local_40;
  BindingAlias *local_38;
  
  other = (aliases->super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>).
          super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
          super__Vector_impl_data._M_start;
  local_50 = (aliases->super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>).
             super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (other != local_50) {
    local_48 = &(this->using_columns)._M_h;
    local_58 = &this->bindings_list;
    do {
      local_78 = 0;
      lStack_70 = 0;
      local_68 = 0;
      p_Var9 = (this->using_columns)._M_h._M_before_begin._M_nxt;
      if (p_Var9 != (_Hash_node_base *)0x0) {
        do {
          p_Var7 = p_Var9[7]._M_nxt;
          if (p_Var7 != (_Hash_node_base *)0x0) {
            local_40 = (value_type *)(p_Var9 + 1);
            do {
              local_38 = (BindingAlias *)p_Var7[1]._M_nxt;
              pBVar11 = (BindingAlias *)local_38[1].catalog._M_dataplus._M_p;
              pBVar1 = (BindingAlias *)local_38[1].catalog._M_string_length;
              lVar10 = (long)pBVar1 - (long)pBVar11;
              lVar8 = (lVar10 >> 5) * -0x5555555555555555 >> 2;
              if (0 < lVar8) {
                lVar8 = lVar8 + 1;
                do {
                  bVar5 = BindingAlias::operator==(pBVar11,other);
                  __first._M_current = pBVar11;
                  if (bVar5) goto LAB_00e1e3da;
                  bVar5 = BindingAlias::operator==(pBVar11 + 1,other);
                  __first._M_current = pBVar11 + 1;
                  if (bVar5) goto LAB_00e1e3da;
                  bVar5 = BindingAlias::operator==(pBVar11 + 2,other);
                  __first._M_current = pBVar11 + 2;
                  if (bVar5) goto LAB_00e1e3da;
                  bVar5 = BindingAlias::operator==(pBVar11 + 3,other);
                  __first._M_current = pBVar11 + 3;
                  if (bVar5) goto LAB_00e1e3da;
                  pBVar11 = pBVar11 + 4;
                  lVar8 = lVar8 + -1;
                  lVar10 = lVar10 + -0x180;
                } while (1 < lVar8);
              }
              lVar8 = (lVar10 >> 5) * -0x5555555555555555;
              if (lVar8 == 1) {
LAB_00e1e3c6:
                bVar5 = BindingAlias::operator==(pBVar11,other);
                __first._M_current = pBVar11;
                if (!bVar5) {
                  __first._M_current = pBVar1;
                }
LAB_00e1e3da:
                pBVar11 = __first._M_current + 1;
                if (pBVar11 != pBVar1 && __first._M_current != pBVar1) {
                  do {
                    bVar5 = BindingAlias::operator==(pBVar11,other);
                    if (!bVar5) {
                      ::std::__cxx11::string::operator=
                                ((string *)__first._M_current,(string *)pBVar11);
                      ::std::__cxx11::string::operator=
                                ((string *)&(__first._M_current)->schema,(string *)&pBVar11->schema)
                      ;
                      ::std::__cxx11::string::operator=
                                ((string *)&(__first._M_current)->alias,(string *)&pBVar11->alias);
                      __first._M_current = __first._M_current + 1;
                    }
                    pBVar11 = pBVar11 + 1;
                  } while (pBVar11 != pBVar1);
                }
              }
              else {
                if (lVar8 == 2) {
LAB_00e1e3ac:
                  bVar5 = BindingAlias::operator==(pBVar11,other);
                  __first._M_current = pBVar11;
                  if (!bVar5) {
                    pBVar11 = pBVar11 + 1;
                    goto LAB_00e1e3c6;
                  }
                  goto LAB_00e1e3da;
                }
                __first._M_current = pBVar1;
                if (lVar8 == 3) {
                  bVar5 = BindingAlias::operator==(pBVar11,other);
                  __first._M_current = pBVar11;
                  if (!bVar5) {
                    pBVar11 = pBVar11 + 1;
                    goto LAB_00e1e3ac;
                  }
                  goto LAB_00e1e3da;
                }
              }
              pBVar11 = local_38;
              ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::_M_erase
                        ((vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_> *)
                         (local_38 + 1),__first,(BindingAlias *)local_38[1].catalog._M_string_length
                        );
              if ((pBVar11[1].catalog._M_dataplus._M_p ==
                   (pointer)pBVar11[1].catalog._M_string_length) ||
                 (bVar5 = BindingAlias::operator==(pBVar11,other), bVar5)) {
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_78,local_40);
              }
              p_Var7 = p_Var7->_M_nxt;
            } while (p_Var7 != (_Hash_node_base *)0x0);
          }
          lVar8 = lStack_70;
          p_Var9 = p_Var9->_M_nxt;
          lVar10 = local_78;
        } while (p_Var9 != (_Hash_node_base *)0x0);
        for (; lVar10 != lVar8; lVar10 = lVar10 + 0x20) {
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_erase(local_48,lVar10);
        }
      }
      this_00 = (this->bindings_list).
                super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (this->bindings_list).
               super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = (long)puVar2 - (long)this_00;
      if (0 < lVar8 >> 5) {
        lVar10 = (lVar8 >> 5) + 1;
        do {
          pBVar6 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                   operator->(this_00);
          bVar5 = BindingAlias::operator==(&pBVar6->alias,other);
          __first_00._M_current = this_00;
          if (bVar5) goto LAB_00e1e5f0;
          pBVar6 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                   operator->(this_00 + 1);
          bVar5 = BindingAlias::operator==(&pBVar6->alias,other);
          __first_00._M_current = this_00 + 1;
          if (bVar5) goto LAB_00e1e5f0;
          pBVar6 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                   operator->(this_00 + 2);
          bVar5 = BindingAlias::operator==(&pBVar6->alias,other);
          __first_00._M_current = this_00 + 2;
          if (bVar5) goto LAB_00e1e5f0;
          pBVar6 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                   operator->(this_00 + 3);
          bVar5 = BindingAlias::operator==(&pBVar6->alias,other);
          __first_00._M_current = this_00 + 3;
          if (bVar5) goto LAB_00e1e5f0;
          this_00 = this_00 + 4;
          lVar10 = lVar10 + -1;
          lVar8 = lVar8 + -0x20;
        } while (1 < lVar10);
      }
      lVar8 = lVar8 >> 3;
      if (lVar8 == 1) {
LAB_00e1e5d0:
        pBVar6 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator->
                           (this_00);
        bVar5 = BindingAlias::operator==(&pBVar6->alias,other);
        __first_00._M_current = this_00;
        if (!bVar5) {
          __first_00._M_current = puVar2;
        }
LAB_00e1e5f0:
        this_01 = __first_00._M_current + 1;
        if (this_01 != puVar2 && __first_00._M_current != puVar2) {
          do {
            pBVar6 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                     operator->(this_01);
            bVar5 = BindingAlias::operator==(&pBVar6->alias,other);
            if (!bVar5) {
              _Var3._M_head_impl =
                   (this_01->
                   super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>)._M_t.
                   super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
                   super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl;
              (this_01->super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>).
              _M_t.super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>.
              _M_t.super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
              super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl = (Binding *)0x0;
              _Var4._M_head_impl =
                   ((__first_00._M_current)->
                   super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>)._M_t.
                   super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
                   super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl;
              ((__first_00._M_current)->
              super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>)._M_t.
              super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
              super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
              super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl = _Var3._M_head_impl;
              if (_Var4._M_head_impl != (Binding *)0x0) {
                (**(code **)((long)(_Var4._M_head_impl)->_vptr_Binding + 8))();
              }
              __first_00._M_current = __first_00._M_current + 1;
            }
            this_01 = this_01 + 1;
          } while (this_01 != puVar2);
        }
      }
      else {
        if (lVar8 == 2) {
LAB_00e1e5b1:
          pBVar6 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                   operator->(this_00);
          bVar5 = BindingAlias::operator==(&pBVar6->alias,other);
          __first_00._M_current = this_00;
          if (!bVar5) {
            this_00 = this_00 + 1;
            goto LAB_00e1e5d0;
          }
          goto LAB_00e1e5f0;
        }
        __first_00._M_current = puVar2;
        if (lVar8 == 3) {
          pBVar6 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                   operator->(this_00);
          bVar5 = BindingAlias::operator==(&pBVar6->alias,other);
          __first_00._M_current = this_00;
          if (!bVar5) {
            this_00 = this_00 + 1;
            goto LAB_00e1e5b1;
          }
          goto LAB_00e1e5f0;
        }
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
      ::_M_erase(&local_58->
                  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                 ,__first_00,
                 (this->bindings_list).
                 super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_78);
      other = other + 1;
    } while (other != local_50);
  }
  return;
}

Assistant:

void BindContext::RemoveContext(const vector<BindingAlias> &aliases) {
	for (auto &alias : aliases) {
		// remove the binding from any USING columns
		vector<string> removed_using_columns;
		for (auto &using_sets : using_columns) {
			for (auto &using_set_ref : using_sets.second) {
				auto &using_set = using_set_ref.get();
				auto it = std::remove_if(using_set.bindings.begin(), using_set.bindings.end(),
				                         [&](const BindingAlias &using_alias) { return using_alias == alias; });
				using_set.bindings.erase(it, using_set.bindings.end());
				if (using_set.bindings.empty() || using_set.primary_binding == alias) {
					// if the using column is no longer referred to - remove it entirely
					removed_using_columns.push_back(using_sets.first);
				}
			}
		}
		for (auto &removed_col : removed_using_columns) {
			using_columns.erase(removed_col);
		}

		// remove the binding from the list of bindings
		auto it = std::remove_if(bindings_list.begin(), bindings_list.end(),
		                         [&](unique_ptr<Binding> &x) { return x->alias == alias; });
		bindings_list.erase(it, bindings_list.end());
	}
}